

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_push_rect_uv
               (nk_draw_list *list,nk_vec2 a,nk_vec2 c,nk_vec2 uva,nk_vec2 uvc,nk_color color)

{
  nk_draw_index nVar1;
  void *pvVar2;
  nk_draw_index *pnVar3;
  nk_vec2 uv;
  nk_vec2 uv_00;
  nk_vec2 pos;
  nk_draw_index index;
  nk_draw_index *idx;
  nk_colorf col;
  nk_vec2 d;
  nk_vec2 b;
  nk_vec2 uvd;
  nk_vec2 uvb;
  void *vtx;
  nk_draw_list *list_local;
  float fStack_28;
  nk_color color_local;
  nk_vec2 uvc_local;
  nk_vec2 uva_local;
  nk_vec2 c_local;
  nk_vec2 a_local;
  
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x27df,
                  "void nk_draw_list_push_rect_uv(struct nk_draw_list *, struct nk_vec2, struct nk_vec2, struct nk_vec2, struct nk_vec2, struct nk_color)"
                 );
  }
  if (list != (nk_draw_list *)0x0) {
    nk_color_fv((float *)&idx,color);
    fStack_28 = uvc.x;
    uvc_local.y = uva.y;
    uv = nk_vec2(fStack_28,uvc_local.y);
    uvc_local.x = uva.x;
    color_local = (nk_color)uvc.y;
    uv_00 = nk_vec2(uvc_local.x,(float)color_local);
    uva_local.x = c.x;
    c_local.y = a.y;
    pos = nk_vec2(uva_local.x,c_local.y);
    c_local.x = a.x;
    uva_local.y = c.y;
    col._8_8_ = nk_vec2(c_local.x,uva_local.y);
    nVar1 = (nk_draw_index)list->vertex_count;
    pvVar2 = nk_draw_list_alloc_vertices(list,4);
    pnVar3 = nk_draw_list_alloc_elements(list,6);
    if ((pvVar2 != (void *)0x0) && (pnVar3 != (nk_draw_index *)0x0)) {
      *pnVar3 = nVar1;
      pnVar3[1] = nVar1 + 1;
      pnVar3[2] = nVar1 + 2;
      pnVar3[3] = nVar1;
      pnVar3[4] = nVar1 + 2;
      pnVar3[5] = nVar1 + 3;
      pvVar2 = nk_draw_vertex(pvVar2,&list->config,a,uva,_idx);
      pvVar2 = nk_draw_vertex(pvVar2,&list->config,pos,uv,_idx);
      pvVar2 = nk_draw_vertex(pvVar2,&list->config,c,uvc,_idx);
      nk_draw_vertex(pvVar2,&list->config,(nk_vec2)col._8_8_,uv_00,_idx);
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_draw_list_push_rect_uv(struct nk_draw_list *list, struct nk_vec2 a,
    struct nk_vec2 c, struct nk_vec2 uva, struct nk_vec2 uvc,
    struct nk_color color)
{
    void *vtx;
    struct nk_vec2 uvb;
    struct nk_vec2 uvd;
    struct nk_vec2 b;
    struct nk_vec2 d;

    struct nk_colorf col;
    nk_draw_index *idx;
    nk_draw_index index;
    NK_ASSERT(list);
    if (!list) return;

    nk_color_fv(&col.r, color);
    uvb = nk_vec2(uvc.x, uva.y);
    uvd = nk_vec2(uva.x, uvc.y);
    b = nk_vec2(c.x, a.y);
    d = nk_vec2(a.x, c.y);

    index = (nk_draw_index)list->vertex_count;
    vtx = nk_draw_list_alloc_vertices(list, 4);
    idx = nk_draw_list_alloc_elements(list, 6);
    if (!vtx || !idx) return;

    idx[0] = (nk_draw_index)(index+0); idx[1] = (nk_draw_index)(index+1);
    idx[2] = (nk_draw_index)(index+2); idx[3] = (nk_draw_index)(index+0);
    idx[4] = (nk_draw_index)(index+2); idx[5] = (nk_draw_index)(index+3);

    vtx = nk_draw_vertex(vtx, &list->config, a, uva, col);
    vtx = nk_draw_vertex(vtx, &list->config, b, uvb, col);
    vtx = nk_draw_vertex(vtx, &list->config, c, uvc, col);
    vtx = nk_draw_vertex(vtx, &list->config, d, uvd, col);
}